

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O1

char libcalc::symbolType(char symbol)

{
  long lVar1;
  
  lVar1 = 0;
  while ((&TOKEN_SYMBOLS)[lVar1] != symbol) {
    lVar1 = lVar1 + 1;
    if ((short)lVar1 == 0x16) {
      return '\x03';
    }
  }
  if (((int)symbol - 0x21U < 0x3e) &&
     ((0x2000000000005791U >> ((ulong)((int)symbol - 0x21U) & 0x3f) & 1) != 0)) {
    return '\x01';
  }
  return '\x02';
}

Assistant:

const char symbolType(const char symbol) {
  bool isValid = false;

  for (short i = 0; i < TOKEN_SYMBOLS_LEN; i++) {
    if (TOKEN_SYMBOLS[i] == symbol) {
      isValid = true;
      break;
    }
  }

  if (isValid == false) {
    return TOKEN_TYPE.GARBAGE;
  }

  return isOperator(symbol) ? TOKEN_TYPE.OPERATOR : TOKEN_TYPE.SYMBOL;
}